

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

DThinker * __thiscall
FDecalSliderAnim::CreateThinker(FDecalSliderAnim *this,DBaseDecal *actor,side_t *wall)

{
  DThinker *this_00;
  int iVar1;
  
  this_00 = (DThinker *)
            M_Malloc_Dbg(0x68,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                         ,0x1f7);
  DThinker::DThinker(this_00,0x24);
  this_00[1].super_DObject._vptr_DObject = (_func_int **)actor;
  (this_00->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_0086d170;
  iVar1 = *(int *)&(this->super_FDecalAnimator).field_0xc + level.maptime;
  *(int *)&this_00[1].super_DObject.Class = iVar1;
  *(int *)((long)&this_00[1].super_DObject.Class + 4) = iVar1 + this->SlideTime;
  this_00[1].super_DObject.ObjNext = (DObject *)this->DistY;
  *(undefined1 *)&this_00[1].NextThinker = 0;
  return this_00;
}

Assistant:

DThinker *FDecalSliderAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalSlider *thinker = new DDecalSlider (actor);

	thinker->TimeToStart = level.maptime + SlideStart;
	thinker->TimeToStop = thinker->TimeToStart + SlideTime;
	/*thinker->DistX = DistX;*/
	thinker->DistY = DistY;
	thinker->bStarted = false;
	return thinker;
}